

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldMessage
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ParseInfoTree *this_00;
  bool bVar2;
  int iVar3;
  ParseInfoTree *pPVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar5;
  _Alloc_hider _Var6;
  string delimeter;
  string local_b8;
  Message *local_98;
  undefined1 *local_90;
  char *local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  string local_70;
  string local_50;
  
  this_00 = this->parse_info_tree_;
  local_98 = message;
  if (this_00 != (ParseInfoTree *)0x0) {
    pPVar4 = ParseInfoTree::CreateNested(this_00,field);
    this->parse_info_tree_ = pPVar4;
  }
  local_90 = &local_80;
  local_88 = (char *)0x0;
  local_80 = 0;
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"<","");
  bVar2 = TryConsume(this,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    pcVar5 = ">";
LAB_002218a0:
    std::__cxx11::string::_M_replace((ulong)&local_90,0,local_88,(ulong)pcVar5);
    if (*(int *)(field + 0x30) == 3) {
      iVar3 = (*reflection->_vptr_Reflection[0x41])(reflection,local_98,field,0);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_90,local_88 + (long)local_90);
      bVar2 = ConsumeMessage(this,(Message *)CONCAT44(extraout_var,iVar3),&local_50);
      local_70.field_2._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
      _Var6._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_00221973:
        operator_delete(_Var6._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      iVar3 = (*reflection->_vptr_Reflection[0x21])(reflection,local_98,field,0);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_90,local_88 + (long)local_90);
      bVar2 = ConsumeMessage(this,(Message *)CONCAT44(extraout_var_00,iVar3),&local_70);
      _Var6._M_p = local_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_00221973;
    }
    if (bVar2 != false) {
      this->parse_info_tree_ = this_00;
      bVar2 = true;
      goto LAB_0022198a;
    }
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"{","");
    bVar2 = Consume(this,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      pcVar5 = "}";
      goto LAB_002218a0;
    }
  }
  bVar2 = false;
LAB_0022198a:
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  return bVar2;
}

Assistant:

bool ConsumeFieldMessage(Message* message,
                           const Reflection* reflection,
                           const FieldDescriptor* field) {

    // If the parse information tree is not NULL, create a nested one
    // for the nested message.
    ParseInfoTree* parent = parse_info_tree_;
    if (parent != NULL) {
      parse_info_tree_ = CreateNested(parent, field);
    }

    string delimeter;
    if (TryConsume("<")) {
      delimeter = ">";
    } else {
      DO(Consume("{"));
      delimeter = "}";
    }

    if (field->is_repeated()) {
      DO(ConsumeMessage(reflection->AddMessage(message, field), delimeter));
    } else {
      DO(ConsumeMessage(reflection->MutableMessage(message, field),
                        delimeter));
    }

    // Reset the parse information tree.
    parse_info_tree_ = parent;
    return true;
  }